

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BindDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BindDirectiveSyntax,slang::syntax::BindDirectiveSyntax_const&>
          (BumpAllocator *this,BindDirectiveSyntax *args)

{
  BindDirectiveSyntax *pBVar1;
  BindDirectiveSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pBVar1 = (BindDirectiveSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::BindDirectiveSyntax::BindDirectiveSyntax(in_RSI,pBVar1);
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }